

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O2

void Hacl_Bignum256_32_add_mod(uint32_t *n,uint32_t *a,uint32_t *b,uint32_t *res)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  
  uVar19 = *a;
  uVar1 = *b;
  uVar17 = uVar19 + *b;
  *res = uVar17;
  uVar26 = a[1];
  uVar2 = (uint)CARRY4(uVar19,uVar1);
  uVar19 = b[1];
  uVar3 = uVar26 + b[1];
  uVar20 = uVar3 + uVar2;
  res[1] = uVar20;
  uVar1 = a[2];
  uVar2 = (uint)(CARRY4(uVar26,uVar19) || CARRY4(uVar3,uVar2));
  uVar19 = b[2];
  uVar3 = uVar1 + b[2];
  uVar21 = uVar3 + uVar2;
  res[2] = uVar21;
  uVar26 = a[3];
  uVar2 = (uint)(CARRY4(uVar1,uVar19) || CARRY4(uVar3,uVar2));
  uVar19 = b[3];
  uVar3 = uVar26 + b[3];
  uVar22 = uVar3 + uVar2;
  res[3] = uVar22;
  uVar1 = a[4];
  uVar2 = (uint)(CARRY4(uVar26,uVar19) || CARRY4(uVar3,uVar2));
  uVar19 = b[4];
  uVar3 = uVar1 + b[4];
  uVar23 = uVar3 + uVar2;
  res[4] = uVar23;
  uVar26 = a[5];
  uVar2 = (uint)(CARRY4(uVar1,uVar19) || CARRY4(uVar3,uVar2));
  uVar19 = b[5];
  uVar3 = uVar26 + b[5];
  uVar24 = uVar3 + uVar2;
  res[5] = uVar24;
  uVar1 = a[6];
  uVar2 = (uint)(CARRY4(uVar26,uVar19) || CARRY4(uVar3,uVar2));
  uVar19 = b[6];
  uVar3 = uVar1 + b[6];
  uVar25 = uVar3 + uVar2;
  res[6] = uVar25;
  uVar26 = a[7];
  uVar2 = (uint)(CARRY4(uVar1,uVar19) || CARRY4(uVar3,uVar2));
  uVar19 = b[7];
  uVar3 = uVar26 + b[7];
  uVar18 = uVar3 + uVar2;
  res[7] = uVar18;
  uVar1 = *n;
  uVar10 = uVar20 - n[1];
  uVar4 = (uint)(uVar20 < n[1] || uVar10 < (uVar17 < uVar1));
  uVar11 = uVar21 - n[2];
  uVar5 = (uint)(uVar21 < n[2] || uVar11 < uVar4);
  uVar12 = uVar22 - n[3];
  uVar6 = (uint)(uVar22 < n[3] || uVar12 < uVar5);
  uVar13 = uVar23 - n[4];
  uVar7 = (uint)(uVar23 < n[4] || uVar13 < uVar6);
  uVar14 = uVar24 - n[5];
  uVar8 = (uint)(uVar24 < n[5] || uVar14 < uVar7);
  uVar15 = uVar25 - n[6];
  uVar9 = (uint)(uVar25 < n[6] || uVar15 < uVar8);
  uVar16 = uVar18 - n[7];
  uVar19 = (uint)(CARRY4(uVar26,uVar19) || CARRY4(uVar3,uVar2)) -
           (uint)(uVar18 < n[7] || uVar16 < uVar9);
  uVar26 = ~uVar19;
  *res = uVar17 - *n & uVar26 | uVar17 & uVar19;
  res[1] = uVar10 - (uVar17 < uVar1) & uVar26 | uVar20 & uVar19;
  res[2] = uVar11 - uVar4 & uVar26 | uVar21 & uVar19;
  res[3] = uVar12 - uVar5 & uVar26 | uVar22 & uVar19;
  res[4] = uVar13 - uVar6 & uVar26 | uVar23 & uVar19;
  res[5] = uVar14 - uVar7 & uVar26 | uVar24 & uVar19;
  res[6] = uVar15 - uVar8 & uVar26 | uVar25 & uVar19;
  res[7] = uVar26 & uVar16 - uVar9 | uVar19 & uVar18;
  return;
}

Assistant:

void Hacl_Bignum256_32_add_mod(uint32_t *n, uint32_t *a, uint32_t *b, uint32_t *res)
{
  uint32_t c0 = 0U;
  KRML_MAYBE_FOR2(i,
    0U,
    2U,
    1U,
    uint32_t t1 = a[4U * i];
    uint32_t t20 = b[4U * i];
    uint32_t *res_i0 = res + 4U * i;
    c0 = Lib_IntTypes_Intrinsics_add_carry_u32(c0, t1, t20, res_i0);
    uint32_t t10 = a[4U * i + 1U];
    uint32_t t21 = b[4U * i + 1U];
    uint32_t *res_i1 = res + 4U * i + 1U;
    c0 = Lib_IntTypes_Intrinsics_add_carry_u32(c0, t10, t21, res_i1);
    uint32_t t11 = a[4U * i + 2U];
    uint32_t t22 = b[4U * i + 2U];
    uint32_t *res_i2 = res + 4U * i + 2U;
    c0 = Lib_IntTypes_Intrinsics_add_carry_u32(c0, t11, t22, res_i2);
    uint32_t t12 = a[4U * i + 3U];
    uint32_t t2 = b[4U * i + 3U];
    uint32_t *res_i = res + 4U * i + 3U;
    c0 = Lib_IntTypes_Intrinsics_add_carry_u32(c0, t12, t2, res_i););
  uint32_t c00 = c0;
  uint32_t tmp[8U] = { 0U };
  uint32_t c = 0U;
  KRML_MAYBE_FOR2(i,
    0U,
    2U,
    1U,
    uint32_t t1 = res[4U * i];
    uint32_t t20 = n[4U * i];
    uint32_t *res_i0 = tmp + 4U * i;
    c = Lib_IntTypes_Intrinsics_sub_borrow_u32(c, t1, t20, res_i0);
    uint32_t t10 = res[4U * i + 1U];
    uint32_t t21 = n[4U * i + 1U];
    uint32_t *res_i1 = tmp + 4U * i + 1U;
    c = Lib_IntTypes_Intrinsics_sub_borrow_u32(c, t10, t21, res_i1);
    uint32_t t11 = res[4U * i + 2U];
    uint32_t t22 = n[4U * i + 2U];
    uint32_t *res_i2 = tmp + 4U * i + 2U;
    c = Lib_IntTypes_Intrinsics_sub_borrow_u32(c, t11, t22, res_i2);
    uint32_t t12 = res[4U * i + 3U];
    uint32_t t2 = n[4U * i + 3U];
    uint32_t *res_i = tmp + 4U * i + 3U;
    c = Lib_IntTypes_Intrinsics_sub_borrow_u32(c, t12, t2, res_i););
  uint32_t c1 = c;
  uint32_t c2 = c00 - c1;
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint32_t *os = res;
    uint32_t x = (c2 & res[i]) | (~c2 & tmp[i]);
    os[i] = x;);
}